

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::requireOnStack(kj *this,void *ptr,StringPtr description)

{
  bool bVar1;
  StringPtr *params;
  bool local_9d;
  String local_90;
  Fault local_78;
  Fault f;
  long *local_68;
  DebugComparison<long_&,_int> local_60;
  bool local_31;
  long lStack_30;
  bool _kjCondition;
  ptrdiff_t offset;
  kj *pkStack_20;
  char stackVar;
  void *ptr_local;
  StringPtr description_local;
  
  description_local.content.ptr = description.content.ptr;
  lStack_30 = (long)this - ((long)&offset + 7);
  pkStack_20 = this;
  ptr_local = ptr;
  local_68 = (long *)_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xffffffffffffffd0);
  f.exception._4_4_ = 0x10000;
  _::DebugExpression<long&>::operator<
            (&local_60,(DebugExpression<long&> *)&local_68,(int *)((long)&f.exception + 4));
  bVar1 = _::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_60);
  local_9d = bVar1 && -0x10000 < lStack_30;
  local_31 = local_9d;
  if (bVar1 && -0x10000 < lStack_30) {
    return;
  }
  str<kj::StringPtr&>(&local_90,(kj *)&ptr_local,params);
  _::Debug::Fault::Fault<kj::Exception::Type,bool&,kj::String>
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
             ,0x4d5,FAILED,"offset < 65536 && offset > -65536","_kjCondition,kj::str(description)",
             &local_31,&local_90);
  String::~String(&local_90);
  _::Debug::Fault::fatal(&local_78);
}

Assistant:

void requireOnStack(void* ptr, kj::StringPtr description) {
#if defined(FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION) || \
    KJ_HAS_COMPILER_FEATURE(address_sanitizer) || \
    defined(__SANITIZE_ADDRESS__)
  // When using libfuzzer or ASAN, this sanity check may spurriously fail, so skip it.
#else
  char stackVar;
  ptrdiff_t offset = reinterpret_cast<char*>(ptr) - &stackVar;
  KJ_REQUIRE(offset < 65536 && offset > -65536,
            kj::str(description));
#endif
}